

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O3

void GEN_CS::gen_cs_example_sm
               (multi_ex *param_1,uint32_t chosen_action,float sign_offset,action_scores action_vals
               ,label *cs_labels)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar5;
  wclass local_68;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_58 = sign_offset;
  uStack_54 = in_XMM0_Db;
  uStack_50 = in_XMM0_Dc;
  uStack_4c = in_XMM0_Dd;
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  if ((long)action_vals._end - (long)action_vals._begin != 0) {
    local_48 = -local_58;
    uStack_44 = uStack_54 ^ 0x80000000;
    uStack_40 = uStack_50 ^ 0x80000000;
    uStack_3c = uStack_4c ^ 0x80000000;
    uVar2 = 0;
    uVar3 = 1;
    do {
      local_68.class_index = action_vals._begin[uVar2].action;
      local_68.partial_prediction = 0.0;
      local_68.wap_value = 0.0;
      fVar4 = local_58;
      if (local_68.class_index != chosen_action) {
        fVar4 = local_48;
      }
      fVar4 = fVar4 + action_vals._begin[uVar2].score;
      fVar5 = 100.0;
      if (fVar4 <= 100.0) {
        fVar5 = fVar4;
      }
      local_68.x = -100.0;
      if (-100.0 <= fVar5) {
        local_68.x = fVar5;
      }
      v_array<COST_SENSITIVE::wclass>::push_back(&cs_labels->costs,&local_68);
      bVar1 = uVar3 < (ulong)((long)action_vals._end - (long)action_vals._begin >> 3);
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar1);
  }
  return;
}

Assistant:

void gen_cs_example_sm(multi_ex&, uint32_t chosen_action, float sign_offset,
    ACTION_SCORE::action_scores action_vals,
    COST_SENSITIVE::label& cs_labels)
{
  cs_labels.costs.clear();
  for (uint32_t i = 0; i < action_vals.size(); i++)
  {
    uint32_t current_action = action_vals[i].action;
    COST_SENSITIVE::wclass wc = {0., current_action, 0., 0.};

    if (current_action == chosen_action)
      wc.x = action_vals[i].score + sign_offset;
    else
      wc.x = action_vals[i].score - sign_offset;

    // TODO: This clipping is conceptually unnecessary because the example weight for this instance should be close to 0.
    if (wc.x > 100.)
      wc.x = 100.0;
    if (wc.x < -100.)
      wc.x = -100.0;

    cs_labels.costs.push_back(wc);
  }
}